

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::ZoneBitVector::copyFrom
          (ZoneBitVector *this,ZoneAllocator *allocator,ZoneBitVector *other)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  Error EVar5;
  ZoneAllocator *size;
  long *in_RDX;
  long *in_RDI;
  size_t allocatedCapacityInBits;
  BitWord *newData;
  size_t allocatedCapacity;
  uint32_t minimumCapacity;
  uint32_t minimumCapacityInBits;
  uint32_t newSize;
  BitWord *data;
  size_t *in_stack_ffffffffffffff68;
  ZoneAllocator *in_stack_ffffffffffffff78;
  ZoneAllocator *in_stack_ffffffffffffff88;
  void *local_60;
  uint local_28;
  
  pvVar2 = (void *)*in_RDI;
  uVar1 = *(uint *)(in_RDX + 1);
  if (uVar1 == 0) {
    *(undefined4 *)(in_RDI + 1) = 0;
    return 0;
  }
  local_60 = pvVar2;
  if (*(uint *)((long)in_RDI + 0xc) < uVar1) {
    uVar4 = uVar1 + 0x3f & 0xffffffc0;
    if (uVar4 < uVar1) {
      EVar5 = DebugUtils::errored(1);
      return EVar5;
    }
    local_60 = ZoneAllocator::alloc
                         (in_stack_ffffffffffffff78,(size_t)in_RDI,in_stack_ffffffffffffff68);
    if (local_60 == (void *)0x0) {
      EVar5 = DebugUtils::errored(1);
      return EVar5;
    }
    size = (ZoneAllocator *)((long)in_stack_ffffffffffffff88 << 3);
    if (size < in_stack_ffffffffffffff88) {
      size = (ZoneAllocator *)(ulong)uVar4;
    }
    if (pvVar2 != (void *)0x0) {
      ZoneAllocator::release(in_stack_ffffffffffffff88,local_60,(size_t)size);
    }
    *in_RDI = (long)local_60;
    *(int *)((long)in_RDI + 0xc) = (int)size;
  }
  *(uint *)(in_RDI + 1) = uVar1;
  lVar3 = *in_RDX;
  for (local_28 = 0; local_28 < uVar1 + 0x3f >> 6; local_28 = local_28 + 1) {
    *(undefined8 *)((long)local_60 + (ulong)local_28 * 8) =
         *(undefined8 *)(lVar3 + (ulong)local_28 * 8);
  }
  return 0;
}

Assistant:

Error ZoneBitVector::copyFrom(ZoneAllocator* allocator, const ZoneBitVector& other) noexcept {
  BitWord* data = _data;
  uint32_t newSize = other.size();

  if (!newSize) {
    _size = 0;
    return kErrorOk;
  }

  if (newSize > _capacity) {
    // Realloc needed... Calculate the minimum capacity (in bytes) required.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(newSize, kBitWordSizeInBits);
    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  _size = newSize;
  _copyBits(data, other.data(), _wordsPerBits(newSize));

  return kErrorOk;
}